

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O3

bool upb_Message_SetExtensionString
               (upb_Message *msg,upb_MiniTableExtension *e,upb_StringView value,upb_Arena *a)

{
  uint8_t uVar1;
  
  uVar1 = (e->field_dont_copy_me__upb_internal_use_only).
          descriptortype_dont_copy_me__upb_internal_use_only;
  if (((e->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only &
      0x10) == 0) {
    if ((uVar1 == '\t') || (uVar1 == '\f')) {
LAB_0018b042:
      __assert_fail("_upb_MiniTableExtension_GetRep_dont_copy_me__upb_internal_use_only(e) == kUpb_FieldRep_StringView"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x2e7,
                    "bool upb_Message_SetExtensionString(struct upb_Message *, const upb_MiniTableExtension *, upb_StringView, upb_Arena *)"
                   );
    }
  }
  else {
    if (uVar1 == '\f') goto LAB_0018b042;
    if (uVar1 != '\x05') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                    ,0x7b,"upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                   );
    }
  }
  __assert_fail("upb_MiniTableExtension_CType(e) == kUpb_CType_String || upb_MiniTableExtension_CType(e) == kUpb_CType_Bytes"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x2e5,
                "bool upb_Message_SetExtensionString(struct upb_Message *, const upb_MiniTableExtension *, upb_StringView, upb_Arena *)"
               );
}

Assistant:

UPB_API_INLINE bool upb_Message_SetExtensionString(
    struct upb_Message* msg, const upb_MiniTableExtension* e,
    upb_StringView value, upb_Arena* a) {
  UPB_ASSUME(upb_MiniTableExtension_CType(e) == kUpb_CType_String ||
             upb_MiniTableExtension_CType(e) == kUpb_CType_Bytes);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableExtension_GetRep)(e) ==
             kUpb_FieldRep_StringView);
  return upb_Message_SetExtension(msg, e, &value, a);
}